

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# versionbits_tests.cpp
# Opt level: O0

VersionBitsTester * __thiscall
VersionBitsTester::TestStateSinceHeight(VersionBitsTester *this,int height,int height_delayed)

{
  bool bVar1;
  uint64_t uVar2;
  VersionBitsTester *in_RDI;
  long in_FS_OFFSET;
  int i;
  CBlockIndex *tip;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd08;
  undefined7 in_stack_fffffffffffffd10;
  undefined1 in_stack_fffffffffffffd17;
  VersionBitsTester *in_stack_fffffffffffffd18;
  const_string *in_stack_fffffffffffffd20;
  RandomMixin<FastRandomContext> *in_stack_fffffffffffffd28;
  const_string *in_stack_fffffffffffffd30;
  lazy_ostream *in_stack_fffffffffffffd38;
  const_string *in_stack_fffffffffffffd40;
  unit_test_log_t *in_stack_fffffffffffffd48;
  int local_244;
  const_string local_228;
  lazy_ostream local_218 [3];
  const_string local_1c0;
  lazy_ostream local_1b0 [2];
  assertion_result local_190;
  unit_test_log_t local_168;
  const_string local_158;
  lazy_ostream local_148 [2];
  assertion_result local_128 [2];
  const_string local_f0;
  lazy_ostream local_e0 [2];
  assertion_result local_c0 [7];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  Tip(in_stack_fffffffffffffd18);
  for (local_244 = 0; local_244 < 6; local_244 = local_244 + 1) {
    uVar2 = RandomMixin<FastRandomContext>::randbits
                      (in_stack_fffffffffffffd28,(int)((ulong)in_stack_fffffffffffffd20 >> 0x20));
    if (uVar2 == 0) {
      do {
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_fffffffffffffd18,
                   (pointer)CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10),
                   (unsigned_long)in_stack_fffffffffffffd08);
        boost::unit_test::basic_cstring<const_char>::basic_cstring
                  ((basic_cstring<const_char> *)in_stack_fffffffffffffd08);
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (in_stack_fffffffffffffd48,in_stack_fffffffffffffd40,
                   (size_t)in_stack_fffffffffffffd38,in_stack_fffffffffffffd30);
        TestConditionChecker::GetStateSinceHeightFor
                  ((TestConditionChecker *)in_stack_fffffffffffffd18,
                   (CBlockIndex *)CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10));
        boost::test_tools::assertion_result::assertion_result
                  ((assertion_result *)in_stack_fffffffffffffd18,(bool)in_stack_fffffffffffffd17);
        boost::unit_test::lazy_ostream::instance();
        tinyformat::format<int>((char *)in_stack_fffffffffffffd38,(int *)in_stack_fffffffffffffd30);
        boost::unit_test::operator<<
                  ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10),
                   in_stack_fffffffffffffd08);
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_fffffffffffffd18,
                   (pointer)CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10),
                   (unsigned_long)in_stack_fffffffffffffd08);
        in_stack_fffffffffffffd08 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        boost::test_tools::tt_detail::report_assertion(local_c0,local_e0,&local_f0,0x87,CHECK);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
        ::~lazy_ostream_impl
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                    *)in_stack_fffffffffffffd08);
        std::__cxx11::string::~string(in_stack_fffffffffffffd08);
        boost::test_tools::assertion_result::~assertion_result
                  ((assertion_result *)in_stack_fffffffffffffd08);
        bVar1 = boost::test_tools::tt_detail::dummy_cond();
      } while (bVar1);
      do {
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_fffffffffffffd18,
                   (pointer)CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10),
                   (unsigned_long)in_stack_fffffffffffffd08);
        boost::unit_test::basic_cstring<const_char>::basic_cstring
                  ((basic_cstring<const_char> *)in_stack_fffffffffffffd08);
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (in_stack_fffffffffffffd48,in_stack_fffffffffffffd40,
                   (size_t)in_stack_fffffffffffffd38,in_stack_fffffffffffffd30);
        TestConditionChecker::GetStateSinceHeightFor
                  ((TestConditionChecker *)in_stack_fffffffffffffd18,
                   (CBlockIndex *)CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10));
        boost::test_tools::assertion_result::assertion_result
                  ((assertion_result *)in_stack_fffffffffffffd18,(bool)in_stack_fffffffffffffd17);
        boost::unit_test::lazy_ostream::instance();
        tinyformat::format<int>((char *)in_stack_fffffffffffffd38,(int *)in_stack_fffffffffffffd30);
        boost::unit_test::operator<<
                  ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10),
                   in_stack_fffffffffffffd08);
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_fffffffffffffd18,
                   (pointer)CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10),
                   (unsigned_long)in_stack_fffffffffffffd08);
        in_stack_fffffffffffffd08 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        boost::test_tools::tt_detail::report_assertion(local_128,local_148,&local_158,0x88,CHECK);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
        ::~lazy_ostream_impl
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                    *)in_stack_fffffffffffffd08);
        std::__cxx11::string::~string(in_stack_fffffffffffffd08);
        boost::test_tools::assertion_result::~assertion_result
                  ((assertion_result *)in_stack_fffffffffffffd08);
        bVar1 = boost::test_tools::tt_detail::dummy_cond();
      } while (bVar1);
      do {
        in_stack_fffffffffffffd48 = &local_168;
        in_stack_fffffffffffffd40 = boost::unit_test::(anonymous_namespace)::unit_test_log;
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_fffffffffffffd18,
                   (pointer)CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10),
                   (unsigned_long)in_stack_fffffffffffffd08);
        boost::unit_test::basic_cstring<const_char>::basic_cstring
                  ((basic_cstring<const_char> *)in_stack_fffffffffffffd08);
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (in_stack_fffffffffffffd48,in_stack_fffffffffffffd40,
                   (size_t)in_stack_fffffffffffffd38,in_stack_fffffffffffffd30);
        TestConditionChecker::GetStateSinceHeightFor
                  ((TestConditionChecker *)in_stack_fffffffffffffd18,
                   (CBlockIndex *)CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10));
        boost::test_tools::assertion_result::assertion_result
                  ((assertion_result *)in_stack_fffffffffffffd18,(bool)in_stack_fffffffffffffd17);
        boost::unit_test::lazy_ostream::instance();
        tinyformat::format<int>((char *)in_stack_fffffffffffffd38,(int *)in_stack_fffffffffffffd30);
        boost::unit_test::operator<<
                  ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10),
                   in_stack_fffffffffffffd08);
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_fffffffffffffd18,
                   (pointer)CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10),
                   (unsigned_long)in_stack_fffffffffffffd08);
        in_stack_fffffffffffffd08 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        boost::test_tools::tt_detail::report_assertion(&local_190,local_1b0,&local_1c0,0x89,CHECK);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
        ::~lazy_ostream_impl
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                    *)in_stack_fffffffffffffd08);
        std::__cxx11::string::~string(in_stack_fffffffffffffd08);
        boost::test_tools::assertion_result::~assertion_result
                  ((assertion_result *)in_stack_fffffffffffffd08);
        bVar1 = boost::test_tools::tt_detail::dummy_cond();
      } while (bVar1);
      do {
        in_stack_fffffffffffffd28 = (RandomMixin<FastRandomContext> *)&stack0xfffffffffffffe30;
        in_stack_fffffffffffffd20 = boost::unit_test::(anonymous_namespace)::unit_test_log;
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_fffffffffffffd18,
                   (pointer)CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10),
                   (unsigned_long)in_stack_fffffffffffffd08);
        in_stack_fffffffffffffd30 = (const_string *)&stack0xfffffffffffffe20;
        boost::unit_test::basic_cstring<const_char>::basic_cstring
                  ((basic_cstring<const_char> *)in_stack_fffffffffffffd08);
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (in_stack_fffffffffffffd48,in_stack_fffffffffffffd40,
                   (size_t)in_stack_fffffffffffffd38,in_stack_fffffffffffffd30);
        TestConditionChecker::GetStateSinceHeightFor
                  ((TestConditionChecker *)in_stack_fffffffffffffd18,
                   (CBlockIndex *)CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10));
        boost::test_tools::assertion_result::assertion_result
                  ((assertion_result *)in_stack_fffffffffffffd18,(bool)in_stack_fffffffffffffd17);
        in_stack_fffffffffffffd38 = boost::unit_test::lazy_ostream::instance();
        tinyformat::format<int>((char *)in_stack_fffffffffffffd38,(int *)in_stack_fffffffffffffd30);
        boost::unit_test::operator<<
                  ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10),
                   in_stack_fffffffffffffd08);
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_fffffffffffffd18,
                   (pointer)CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10),
                   (unsigned_long)in_stack_fffffffffffffd08);
        in_stack_fffffffffffffd08 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)(local_218 + 2),local_218,&local_228,0x8a,CHECK);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
        ::~lazy_ostream_impl
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                    *)in_stack_fffffffffffffd08);
        std::__cxx11::string::~string(in_stack_fffffffffffffd08);
        boost::test_tools::assertion_result::~assertion_result
                  ((assertion_result *)in_stack_fffffffffffffd08);
        bVar1 = boost::test_tools::tt_detail::dummy_cond();
      } while (bVar1);
    }
  }
  in_RDI->num = in_RDI->num + 1;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

VersionBitsTester& TestStateSinceHeight(int height, int height_delayed)
    {
        const CBlockIndex* tip = Tip();
        for (int i = 0; i < CHECKERS; i++) {
            if (m_rng.randbits(i) == 0) {
                BOOST_CHECK_MESSAGE(checker[i].GetStateSinceHeightFor(tip) == height, strprintf("Test %i for StateSinceHeight", num));
                BOOST_CHECK_MESSAGE(checker_delayed[i].GetStateSinceHeightFor(tip) == height_delayed, strprintf("Test %i for StateSinceHeight (delayed)", num));
                BOOST_CHECK_MESSAGE(checker_always[i].GetStateSinceHeightFor(tip) == 0, strprintf("Test %i for StateSinceHeight (always active)", num));
                BOOST_CHECK_MESSAGE(checker_never[i].GetStateSinceHeightFor(tip) == 0, strprintf("Test %i for StateSinceHeight (never active)", num));
            }
        }
        num++;
        return *this;
    }